

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::glyphAttrs(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *nodes;
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  undefined8 *puVar6;
  AST *pAVar7;
  NoViableAltException *pNVar8;
  AST *pAVar9;
  int type;
  RefCount<AST> *this_01;
  RefAST tmp100_AST;
  RefAST tmp99_AST;
  RefAST glyphAttrs_AST;
  RefAST X1_AST;
  RefAST A_AST;
  RefAST I_AST;
  RefAST X3_AST;
  RefAST X2_AST;
  ASTPair currentAST;
  RefToken I;
  undefined1 local_110 [16];
  RefCount<AST> local_100;
  ASTFactory local_f8;
  RefCount<AST> local_e8;
  RefCount<AST> local_e0;
  RefCount<AST> local_d8;
  RefCount<AST> local_d0;
  ASTPair local_c8;
  undefined1 local_b0 [16];
  RefCount<Token> local_a0;
  ASTFactory local_98;
  RefCount<Token> local_88;
  RefCount<Token> local_80;
  RefCount<AST> local_78;
  RefCount<AST> local_70;
  RefToken local_68;
  RefCount<AST> local_60;
  RefCount<AST> local_58;
  RefToken local_50;
  RefCount<AST> local_48;
  RefToken local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_f8.nodeFactory = (factory_type)nullAST;
  local_c8.root.ref = (Ref *)0x0;
  local_c8.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_100.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
    local_100.ref = (Ref *)local_f8.nodeFactory;
  }
  local_80.ref = nullToken.ref;
  if (nullToken.ref == (Ref *)0x0) {
    local_80.ref = (Ref *)0x0;
  }
  else {
    (nullToken.ref)->count = (nullToken.ref)->count + 1;
  }
  if ((Ref *)local_f8.nodeFactory == (Ref *)0x0) {
    local_f8.nodeFactory = (factory_type)0x0;
  }
  else {
    uVar4 = ((Ref *)local_f8.nodeFactory)->count;
    ((Ref *)local_f8.nodeFactory)->count = uVar4 + 1;
    ((Ref *)local_f8.nodeFactory)->count = uVar4 + 2;
    uVar4 = ((Ref *)local_f8.nodeFactory)->count;
    ((Ref *)local_f8.nodeFactory)->count = uVar4 + 1;
    ((Ref *)local_f8.nodeFactory)->count = uVar4 + 2;
    ((Ref *)local_f8.nodeFactory)->count = ((Ref *)local_f8.nodeFactory)->count + 1;
  }
  local_e8.ref = (Ref *)local_f8.nodeFactory;
  local_e0.ref = (Ref *)local_f8.nodeFactory;
  local_d8.ref = (Ref *)local_f8.nodeFactory;
  local_d0.ref = (Ref *)local_f8.nodeFactory;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(local_110,this,1);
  RefCount<Token>::operator=(&local_80,(RefCount<Token> *)local_110);
  RefCount<Token>::~RefCount((RefCount<Token> *)local_110);
  nodes = &(this->super_LLkParser).super_Parser.astFactory;
  if (local_80.ref == (Ref *)0x0) {
    local_38.ref = (Ref *)0x0;
  }
  else {
    (local_80.ref)->count = (local_80.ref)->count + 1;
    local_38.ref = local_80.ref;
  }
  ASTFactory::create((ASTFactory *)local_110,(RefToken *)nodes);
  RefCount<AST>::operator=(&local_e0,(RefCount<AST> *)local_110);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_110);
  RefCount<Token>::~RefCount(&local_38);
  Parser::match((Parser *)this,0xd);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  local_110._0_8_ = nullAST;
  type = (int)nodes;
  if (iVar3 == 0xb) {
    if (nullAST.ref == (Ref *)0x0) {
      local_110._0_8_ = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
    ASTFactory::create((ASTFactory *)(local_110 + 8),(RefToken *)nodes);
    RefCount<AST>::operator=((RefCount<AST> *)local_110,(RefCount<AST> *)(local_110 + 8));
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_110 + 8));
    RefCount<Token>::~RefCount(&local_88);
    Parser::match((Parser *)this,0xb);
    uVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (0x3f < uVar4) {
LAB_001971d8:
      pNVar8 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
      NoViableAltException::NoViableAltException(pNVar8,&local_40);
      __cxa_throw(pNVar8,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if ((0xe000000000822000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      if ((ulong)uVar4 != 0xc) goto LAB_001971d8;
    }
    else {
      attrItemList(this);
      RefCount<AST>::operator=((RefCount<AST> *)&local_f8.nodeFactory,this_00);
    }
    local_110._8_8_ = nullAST.ref;
    if (nullAST.ref == (Ref *)0x0) {
      local_110._8_8_ = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98.nodeFactory,this,1);
    ASTFactory::create(&local_f8,(RefToken *)nodes);
    RefCount<AST>::operator=((RefCount<AST> *)(local_110 + 8),(RefCount<AST> *)&local_f8);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_f8);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_98.nodeFactory);
    Parser::match((Parser *)this,0xc);
    piVar5 = (int *)operator_new(0x20);
    *piVar5 = 0;
    piVar5[2] = 0;
    piVar5[3] = 0;
    piVar5[4] = 0;
    piVar5[5] = 0;
    piVar5[6] = 0;
    piVar5[7] = 0;
    puVar6 = (undefined8 *)operator_new(0x10);
    *(undefined8 **)(piVar5 + 2) = puVar6;
    *(undefined8 **)(piVar5 + 4) = puVar6;
    *(undefined8 **)(piVar5 + 6) = puVar6 + 2;
    *puVar6 = 0;
    puVar6[1] = 0;
    *(undefined8 **)(piVar5 + 4) = puVar6 + 2;
    ASTFactory::create(&local_98,type);
    iVar3 = *piVar5;
    *piVar5 = iVar3 + 1;
    RefCount<AST>::operator=
              ((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar5 + 2)),(RefCount<AST> *)&local_98
              );
    if ((Ref *)local_f8.nodeFactory == (Ref *)0x0) {
      local_48.ref = (Ref *)0x0;
    }
    else {
      *(uint *)((long)local_f8.nodeFactory + 8) = *(uint *)((long)local_f8.nodeFactory + 8) + 1;
      local_48.ref = (Ref *)local_f8.nodeFactory;
    }
    iVar3 = *piVar5;
    *piVar5 = iVar3 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar5 + 2)),&local_48);
    ASTFactory::make(&local_f8,(ASTArray *)nodes);
    RefCount<AST>::operator=(&local_e8,(RefCount<AST> *)&local_f8);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_f8);
    RefCount<AST>::~RefCount(&local_48);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_98);
    puVar1 = local_110;
  }
  else {
    if (iVar3 != 0x12) {
      pNVar8 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
      NoViableAltException::NoViableAltException(pNVar8,&local_68);
      __cxa_throw(pNVar8,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if (nullAST.ref == (Ref *)0x0) {
      local_110._0_8_ = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a0,this,1);
    ASTFactory::create((ASTFactory *)(local_110 + 8),(RefToken *)nodes);
    RefCount<AST>::operator=((RefCount<AST> *)local_110,(RefCount<AST> *)(local_110 + 8));
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_110 + 8));
    RefCount<Token>::~RefCount(&local_a0);
    Parser::match((Parser *)this,0x12);
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    bVar2 = BitSet::member(&_tokenSet_25,iVar3);
    if (bVar2) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      bVar2 = BitSet::member(&_tokenSet_26,iVar3);
      if (!bVar2) goto LAB_00196c4b;
      attrItemFlat(this);
      this_01 = &local_d0;
    }
    else {
LAB_00196c4b:
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      bVar2 = BitSet::member(&_tokenSet_25,iVar3);
      if ((!bVar2) ||
         (iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2), iVar3 != 0xb)) {
        pNVar8 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
        NoViableAltException::NoViableAltException(pNVar8,&local_50);
        __cxa_throw(pNVar8,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      attrItemStruct(this);
      this_01 = &local_d8;
    }
    RefCount<AST>::operator=(this_01,this_00);
    piVar5 = (int *)operator_new(0x20);
    *piVar5 = 0;
    piVar5[2] = 0;
    piVar5[3] = 0;
    piVar5[4] = 0;
    piVar5[5] = 0;
    piVar5[6] = 0;
    piVar5[7] = 0;
    puVar6 = (undefined8 *)operator_new(0x18);
    *(undefined8 **)(piVar5 + 2) = puVar6;
    *(undefined8 **)(piVar5 + 4) = puVar6;
    *(undefined8 **)(piVar5 + 6) = puVar6 + 3;
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar6[2] = 0;
    *(undefined8 **)(piVar5 + 4) = puVar6 + 3;
    ASTFactory::create((ASTFactory *)(local_b0 + 8),type);
    iVar3 = *piVar5;
    *piVar5 = iVar3 + 1;
    RefCount<AST>::operator=
              ((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar5 + 2)),
               (RefCount<AST> *)(local_b0 + 8));
    if (local_d0.ref == (Ref *)0x0) {
      local_58.ref = (Ref *)0x0;
    }
    else {
      (local_d0.ref)->count = (local_d0.ref)->count + 1;
      local_58.ref = local_d0.ref;
    }
    iVar3 = *piVar5;
    *piVar5 = iVar3 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar5 + 2)),&local_58);
    if (local_d8.ref == (Ref *)0x0) {
      local_60.ref = (Ref *)0x0;
    }
    else {
      (local_d8.ref)->count = (local_d8.ref)->count + 1;
      local_60.ref = local_d8.ref;
    }
    iVar3 = *piVar5;
    *piVar5 = iVar3 + 1;
    RefCount<AST>::operator=((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar5 + 2)),&local_60);
    ASTFactory::make((ASTFactory *)(local_110 + 8),(ASTArray *)nodes);
    RefCount<AST>::operator=(&local_e8,(RefCount<AST> *)(local_110 + 8));
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_110 + 8));
    RefCount<AST>::~RefCount(&local_60);
    RefCount<AST>::~RefCount(&local_58);
    puVar1 = local_b0;
  }
  RefCount<AST>::~RefCount((RefCount<AST> *)(puVar1 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)local_110);
  RefCount<AST>::operator=(&local_100,&local_c8.root);
  piVar5 = (int *)operator_new(0x20);
  *piVar5 = 0;
  piVar5[2] = 0;
  piVar5[3] = 0;
  piVar5[4] = 0;
  piVar5[5] = 0;
  piVar5[6] = 0;
  piVar5[7] = 0;
  puVar6 = (undefined8 *)operator_new(0x18);
  *(undefined8 **)(piVar5 + 2) = puVar6;
  *(undefined8 **)(piVar5 + 4) = puVar6;
  *(undefined8 **)(piVar5 + 6) = puVar6 + 3;
  *puVar6 = 0;
  puVar6[1] = 0;
  puVar6[2] = 0;
  *(undefined8 **)(piVar5 + 4) = puVar6 + 3;
  ASTFactory::create((ASTFactory *)local_b0,type);
  iVar3 = *piVar5;
  *piVar5 = iVar3 + 1;
  RefCount<AST>::operator=
            ((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar5 + 2)),(RefCount<AST> *)local_b0);
  if (local_e0.ref == (Ref *)0x0) {
    local_70.ref = (Ref *)0x0;
  }
  else {
    (local_e0.ref)->count = (local_e0.ref)->count + 1;
    local_70.ref = local_e0.ref;
  }
  iVar3 = *piVar5;
  *piVar5 = iVar3 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar5 + 2)),&local_70);
  if (local_e8.ref == (Ref *)0x0) {
    local_78.ref = (Ref *)0x0;
  }
  else {
    (local_e8.ref)->count = (local_e8.ref)->count + 1;
    local_78.ref = local_e8.ref;
  }
  iVar3 = *piVar5;
  *piVar5 = iVar3 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar5 + 2)),&local_78);
  ASTFactory::make((ASTFactory *)local_110,(ASTArray *)nodes);
  RefCount<AST>::operator=(&local_100,(RefCount<AST> *)local_110);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_110);
  RefCount<AST>::~RefCount(&local_78);
  RefCount<AST>::~RefCount(&local_70);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_b0);
  RefCount<AST>::operator=(&local_c8.root,&local_100);
  if (local_100.ref == (Ref *)0x0) {
    pAVar7 = (AST *)0x0;
  }
  else {
    pAVar7 = (local_100.ref)->ptr;
  }
  if (nullAST.ref == (Ref *)0x0) {
    pAVar9 = (AST *)0x0;
  }
  else {
    pAVar9 = (nullAST.ref)->ptr;
  }
  bVar2 = pAVar7 != pAVar9;
  if (bVar2) {
    AST::getFirstChild((local_100.ref)->ptr);
    if ((Ref *)local_110._8_8_ == (Ref *)0x0) {
      pAVar7 = (AST *)0x0;
    }
    else {
      pAVar7 = *(AST **)local_110._8_8_;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar9 = (AST *)0x0;
    }
    else {
      pAVar9 = (nullAST.ref)->ptr;
    }
    if (pAVar7 != pAVar9) {
      bVar2 = true;
      AST::getFirstChild((local_100.ref)->ptr);
      goto LAB_00197120;
    }
  }
  if (local_100.ref == (Ref *)0x0) {
    local_110._0_8_ = (Ref *)0x0;
  }
  else {
    (local_100.ref)->count = (local_100.ref)->count + 1;
    local_110._0_8_ = local_100.ref;
  }
LAB_00197120:
  RefCount<AST>::operator=(&local_c8.child,(RefCount<AST> *)local_110);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_110);
  if (bVar2) {
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_110 + 8));
  }
  ASTPair::advanceChildToEnd(&local_c8);
  RefCount<AST>::operator=(this_00,&local_100);
  RefCount<AST>::~RefCount(&local_d8);
  RefCount<AST>::~RefCount(&local_d0);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_f8.nodeFactory);
  RefCount<AST>::~RefCount(&local_e8);
  RefCount<AST>::~RefCount(&local_e0);
  RefCount<Token>::~RefCount(&local_80);
  RefCount<AST>::~RefCount(&local_100);
  RefCount<AST>::~RefCount(&local_c8.child);
  RefCount<AST>::~RefCount(&local_c8.root);
  return;
}

Assistant:

void GrpParser::glyphAttrs() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST glyphAttrs_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefAST A_AST = nullAST;
	RefAST X1_AST = nullAST;
	RefAST X2_AST = nullAST;
	RefAST X3_AST = nullAST;
	
	try {      // for error handling
		I = LT(1);
		I_AST = astFactory.create(I);
		match(IDENT);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			RefAST tmp98_AST = nullAST;
			tmp98_AST = astFactory.create(LT(1));
			match(OP_LBRACE);
			{
			switch ( LA(1)) {
			case IDENT:
			case LIT_INT:
			case LITERAL_glyph:
			case LITERAL_justify:
			case LITERAL_min:
			case LITERAL_max:
			{
				attrItemList();
				X1_AST = returnAST;
				break;
			}
			case OP_RBRACE:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			RefAST tmp99_AST = nullAST;
			tmp99_AST = astFactory.create(LT(1));
			match(OP_RBRACE);
			A_AST = astFactory.make( (new ASTArray(2))->add(astFactory.create(Zattrs))->add(X1_AST));
			break;
		}
		case OP_DOT:
		{
			RefAST tmp100_AST = nullAST;
			tmp100_AST = astFactory.create(LT(1));
			match(OP_DOT);
			{
			if ((_tokenSet_25.member(LA(1))) && (_tokenSet_26.member(LA(2)))) {
				attrItemFlat();
				X2_AST = returnAST;
			}
			else if ((_tokenSet_25.member(LA(1))) && (LA(2)==OP_LBRACE)) {
				attrItemStruct();
				X3_AST = returnAST;
			}
			else {
				throw NoViableAltException(LT(1));
			}
			
			}
			A_AST = astFactory.make( (new ASTArray(3))->add(astFactory.create(Zattrs))->add(X2_AST)->add(X3_AST));
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		glyphAttrs_AST = currentAST.root;
		glyphAttrs_AST = astFactory.make( (new ASTArray(3))->add(astFactory.create(OP_PLUSEQUAL))->add(I_AST)->add(A_AST));
		currentAST.root = glyphAttrs_AST;
		currentAST.child = glyphAttrs_AST!=nullAST &&glyphAttrs_AST->getFirstChild()!=nullAST ?
			glyphAttrs_AST->getFirstChild() : glyphAttrs_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_24);
	}
	returnAST = glyphAttrs_AST;
}